

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v10::detail::format_decimal<char,unsigned_int>(char *out,uint value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  char *end;
  bool local_41;
  int local_40;
  uint32_t local_3c;
  char *local_38;
  char *local_30;
  char *local_10;
  char *local_8;
  
  local_40 = in_EDX;
  local_3c = in_ESI;
  local_38 = (char *)in_RDI;
  iVar2 = count_digits(in_ESI);
  local_41 = iVar2 <= in_EDX;
  ignore_unused<bool,char[20]>(&local_41,(char (*) [20])"invalid digit count");
  pcVar3 = (char *)((long)local_38 + (long)local_40);
  local_38 = pcVar3;
  for (; 99 < local_3c; local_3c = local_3c / 100) {
    pcVar4 = local_38 + -2;
    local_38 = pcVar4;
    local_10 = digits2((ulong)local_3c % 100);
    *(undefined2 *)pcVar4 = *(undefined2 *)local_10;
    local_8 = pcVar4;
  }
  if (local_3c < 10) {
    local_30 = local_38 + -1;
    local_38[-1] = (char)local_3c + '0';
  }
  else {
    pcVar4 = local_38 + -2;
    local_38 = pcVar4;
    pcVar5 = digits2((ulong)local_3c);
    *(undefined2 *)pcVar4 = *(undefined2 *)pcVar5;
    local_30 = local_38;
  }
  fVar1.end = pcVar3;
  fVar1.begin = local_30;
  return fVar1;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}